

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::PythonParameter::MergeFrom(PythonParameter *this,PythonParameter *from)

{
  uint uVar1;
  LogMessage *other;
  string *psVar2;
  InternalMetadataWithArena *this_00;
  LogFinisher local_c5;
  uint32 cached_has_bits;
  byte local_b1;
  LogMessage local_b0;
  PythonParameter *local_78;
  PythonParameter *from_local;
  PythonParameter *this_local;
  InternalMetadataWithArena *local_60;
  InternalMetadataWithArena *local_58;
  undefined4 local_3c;
  HasBits<1UL> *local_38;
  InternalMetadataWithArena *local_30;
  Container *local_28;
  InternalMetadataWithArena *local_20;
  InternalMetadataWithArena *local_18;
  InternalMetadataWithArena *local_10;
  
  local_b1 = 0;
  local_78 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0x85a6);
    local_b1 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_b0,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_c5,other);
  }
  if ((local_b1 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_b0);
  }
  this_00 = &this->_internal_metadata_;
  this_local = (PythonParameter *)&local_78->_internal_metadata_;
  local_60 = this_00;
  local_58 = (InternalMetadataWithArena *)this_local;
  local_10 = (InternalMetadataWithArena *)this_local;
  if (((uint)(((InternalMetadataWithArena *)this_local)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = (InternalMetadataWithArena *)this_local;
    local_20 = (InternalMetadataWithArena *)this_local;
    local_18 = (InternalMetadataWithArena *)this_local;
    if (((uint)(((InternalMetadataWithArena *)this_local)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_local);
    }
    else {
      local_28 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArena::default_instance();
    }
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (this_00,&local_28->unknown_fields);
  }
  local_38 = &local_78->_has_bits_;
  local_3c = 0;
  uVar1 = local_38->has_bits_[0];
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      set_has_module(this);
      psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->module_,psVar2,(local_78->module_).ptr_);
    }
    if ((uVar1 & 2) != 0) {
      set_has_layer(this);
      psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->layer_,psVar2,(local_78->layer_).ptr_);
    }
    if ((uVar1 & 4) != 0) {
      set_has_param_str(this);
      psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->param_str_,psVar2,(local_78->param_str_).ptr_);
    }
    if ((uVar1 & 8) != 0) {
      this->share_in_parallel_ = (bool)(local_78->share_in_parallel_ & 1);
    }
    (this->_has_bits_).has_bits_[0] = uVar1 | (this->_has_bits_).has_bits_[0];
  }
  return;
}

Assistant:

void PythonParameter::MergeFrom(const PythonParameter& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:caffe.PythonParameter)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 15u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_module();
      module_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.module_);
    }
    if (cached_has_bits & 0x00000002u) {
      set_has_layer();
      layer_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.layer_);
    }
    if (cached_has_bits & 0x00000004u) {
      set_has_param_str();
      param_str_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.param_str_);
    }
    if (cached_has_bits & 0x00000008u) {
      share_in_parallel_ = from.share_in_parallel_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}